

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbFunc.c
# Opt level: O3

void Acb_FindReplace(sat_solver *pSat,int iFirstDiv,Vec_Int_t *vWeights,Vec_Wrd_t *vPats,int nPats,
                    Vec_Int_t *vSupp)

{
  uint uVar1;
  int iVar2;
  word *pwVar3;
  uint uVar4;
  ulong uVar5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  uint uVar10;
  long lVar11;
  long lVar12;
  int *begin;
  word Mask [256];
  word Covered [256];
  word Both [256];
  ulong local_1838 [256];
  ulong local_1038 [256];
  ulong auStack_838 [257];
  
  uVar10 = ((nPats >> 6) + 1) - (uint)((nPats & 0x3fU) == 0);
  if (0x100 < (int)uVar10) {
    __assert_fail("nWords <= NWORDS",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acbFunc.c"
                  ,0x429,
                  "void Acb_FindReplace(sat_solver *, int, Vec_Int_t *, Vec_Wrd_t *, int, Vec_Int_t *)"
                 );
  }
  uVar8 = (ulong)uVar10;
  if (0 < (int)uVar10) {
    memset(local_1838,0,uVar8 * 8);
  }
  if (0 < nPats) {
    uVar4 = 0;
    do {
      local_1838[uVar4 >> 6] = local_1838[uVar4 >> 6] | 1L << ((byte)uVar4 & 0x3f);
      uVar4 = uVar4 + 1;
    } while (nPats != uVar4);
  }
  uVar4 = vSupp->nSize;
  if (0 < (int)uVar4) {
    lVar11 = 0;
    do {
      begin = vSupp->pArray;
      uVar1 = begin[lVar11];
      if ((int)uVar1 < 0) {
LAB_00395c30:
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                      ,0x12f,"int Abc_Lit2Var(int)");
      }
      if (0 < (int)uVar10) {
        memset(local_1038,0,uVar8 * 8);
      }
      if (0 < (int)uVar4) {
        uVar5 = 0;
        do {
          uVar7 = begin[uVar5];
          if (uVar7 != uVar1) {
            if ((int)uVar7 < 0) goto LAB_00395c30;
            iVar6 = (uVar7 >> 1) - iFirstDiv;
            if ((iVar6 < 0) || (uVar7 = iVar6 * 0x100, vPats->nSize <= (int)uVar7))
            goto LAB_00395c11;
            if (0 < (int)uVar10) {
              pwVar3 = vPats->pArray;
              uVar9 = 0;
              do {
                local_1038[uVar9] = local_1038[uVar9] | pwVar3[uVar7 + uVar9];
                uVar9 = uVar9 + 1;
              } while (uVar8 != uVar9);
            }
          }
          uVar5 = uVar5 + 1;
        } while (uVar5 != uVar4);
      }
      uVar7 = (uVar1 >> 1) - iFirstDiv;
      if (0 < (int)uVar7) {
        lVar12 = 0;
        uVar5 = 0;
        do {
          if (((long)vWeights->nSize <= (long)uVar5) || ((uint)vWeights->nSize <= uVar7)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          iVar6 = vWeights->pArray[uVar7];
          iVar2 = vWeights->pArray[uVar5];
          if (iVar2 != iVar6) {
            if (iVar6 <= iVar2) {
              __assert_fail("Vec_IntEntry(vWeights, k) < Vec_IntEntry(vWeights, iDiv)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acbFunc.c"
                            ,0x440,
                            "void Acb_FindReplace(sat_solver *, int, Vec_Int_t *, Vec_Wrd_t *, int, Vec_Int_t *)"
                           );
            }
            if ((long)vPats->nSize <= (long)(uVar5 * 0x100)) {
LAB_00395c11:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                            ,0x1be,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
            }
            if (0 < (int)uVar10) {
              pwVar3 = vPats->pArray;
              uVar9 = 0;
              do {
                auStack_838[uVar9] =
                     *(ulong *)((long)pwVar3 + uVar9 * 8 + lVar12) | local_1038[uVar9];
                uVar9 = uVar9 + 1;
              } while (uVar8 != uVar9);
              uVar9 = 0;
              do {
                if (auStack_838[uVar9] != local_1838[uVar9]) goto LAB_00395ba6;
                uVar9 = uVar9 + 1;
              } while (uVar8 != uVar9);
            }
            if ((long)(uVar5 + (long)iFirstDiv) < 0) {
              __assert_fail("Var >= 0 && !(c >> 1)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                            ,0x12e,"int Abc_Var2Lit(int, int)");
            }
            if (vSupp->nSize <= lVar11) {
LAB_00395c4f:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                            ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
            }
            begin[lVar11] = (int)(uVar5 + (long)iFirstDiv) * 2 + 1;
            iVar6 = sat_solver_solve(pSat,begin,begin + vSupp->nSize,0,0,0,0);
            uVar4 = vSupp->nSize;
            if (iVar6 == -1) goto LAB_00395bd1;
            if ((int)uVar4 <= lVar11) goto LAB_00395c4f;
            begin = vSupp->pArray;
            begin[lVar11] = uVar1;
          }
LAB_00395ba6:
          uVar5 = uVar5 + 1;
          lVar12 = lVar12 + 0x800;
        } while (uVar5 != uVar7);
        uVar4 = vSupp->nSize;
      }
LAB_00395bd1:
      lVar11 = lVar11 + 1;
    } while (lVar11 < (int)uVar4);
  }
  return;
}

Assistant:

void Acb_FindReplace( sat_solver * pSat, int iFirstDiv, Vec_Int_t * vWeights, Vec_Wrd_t * vPats, int nPats, Vec_Int_t * vSupp )
{
    int i, k, iLit, iLit2, status, nWords = Abc_Bit6WordNum(nPats);
    word Covered[NWORDS], Both[NWORDS], Mask[NWORDS], * pMask; 
    assert( nWords <= NWORDS );
    // prepare constant pattern
    Abc_TtConst( Mask, nWords, 0 );
    for ( i = 0; i < nPats; i++ )
        Abc_TtSetBit( Mask, i );
    // try to replace each by a cheaper one
    Vec_IntForEachEntry( vSupp, iLit, i )
    {
        int iDiv = Abc_Lit2Var(iLit) - iFirstDiv;
        // collect covered except by this one
        Abc_TtConst( Covered, nWords, 0 );
        Vec_IntForEachEntry( vSupp, iLit2, k )
        {
            if ( iLit2 == iLit )
                continue;
            pMask = Vec_WrdEntryP( vPats, NWORDS*(Abc_Lit2Var(iLit2) - iFirstDiv) );
            Abc_TtOr( Covered, Covered, pMask, nWords );
        }
        // consider any cheaper ones that this one
        for ( k = 0; k < iDiv; k++ )
        {
            if ( Vec_IntEntry(vWeights, k) == Vec_IntEntry(vWeights, iDiv) )
                continue;
            assert( Vec_IntEntry(vWeights, k) < Vec_IntEntry(vWeights, iDiv) );
            pMask = Vec_WrdEntryP( vPats, NWORDS*k );
            // check if it covers the remaining ones
            Abc_TtOr( Both, Covered, pMask, nWords );
            if ( !Abc_TtEqual(Both, Mask, nWords) )
                continue;
            // try this one
            Vec_IntWriteEntry( vSupp, i, Abc_Var2Lit(iFirstDiv+k, 1) );
            status = sat_solver_solve( pSat, Vec_IntArray(vSupp), Vec_IntLimit(vSupp), 0, 0, 0, 0 );
            if ( status == l_False ) // success
            {
                //printf( "Replacing %d(%d) by %d(%d) with const difference %d.\n",
                //    iDiv, Vec_IntEntry(vWeights, iDiv), k, Vec_IntEntry(vWeights, k), 
                //    Vec_IntEntry(vWeights, iDiv) - Vec_IntEntry(vWeights, k) );
                break;
            }
            Vec_IntWriteEntry( vSupp, i, iLit );
        }
    }
}